

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

void sm3_speed(void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  long in_RDI;
  double dVar7;
  int i;
  int64_t end_time;
  int64_t start_time;
  uint32_t ticks_hi;
  uint32_t ticks_lo;
  uint32_t start_tick_hi;
  uint32_t start_tick_lo;
  TEST_ARGS *args;
  uchar msg [8192];
  uint8_t digest [32];
  int64_t block;
  double avg_speed_Gb;
  double avg_speed_MB;
  double usec;
  int64_t N;
  long local_2098;
  int local_2084;
  uint8_t *in_stack_ffffffffffffdfb8;
  uint in_stack_ffffffffffffdfc4;
  uint8_t *in_stack_ffffffffffffdfc8;
  
  if (*(long *)(in_RDI + 8) * 5 < 0x186a1) {
    local_2098 = *(long *)(in_RDI + 8) * 5;
  }
  else {
    local_2098 = 100000;
  }
  uVar1 = rdtsc();
  iVar3 = gettime_i64();
  for (local_2084 = 0; local_2084 < local_2098; local_2084 = local_2084 + 1) {
    SM3_once(in_stack_ffffffffffffdfc8,in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfb8);
  }
  uVar2 = rdtsc();
  iVar4 = gettime_i64();
  dVar7 = (double)(local_2098 << 0xd) / (double)(iVar4 - iVar3);
  lVar5 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  lVar6 = (local_2098 << 0xd) / 0x40;
  printf("average cycles per block : %ld \n",lVar5 / lVar6,lVar5 % lVar6);
  printf("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
  printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n",(double)(iVar4 - iVar3) / 1000.0,dVar7,
         (dVar7 * 8.0) / 1000.0,0x2000);
  return;
}

Assistant:

static void sm3_speed(void *p)
{
    int64_t N;
    double usec;
    double avg_speed_MB, avg_speed_Gb;
    const int64_t block = 8192;

    uint8_t digest[32];
    unsigned char msg[8192];

    TEST_ARGS *args = (TEST_ARGS*)p;
    N = args->N * 5 > 100000 ? 100000 : args->N * 5;

    BENCH_VARS;
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        SM3_once(msg, block, digest);

    COUNTER_STOP();
    TIMER_STOP();

    usec = USEC();
    avg_speed_MB = (N * block) / usec;
    avg_speed_Gb = 8 * avg_speed_MB / 1000;

    printf("average cycles per block : %ld \n", (int64_t)(TICKS() / (N * block / 64)));
    printf("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
    printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n", block, usec/1000, avg_speed_MB, avg_speed_Gb);
}